

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

bool __thiscall
QAbstractItemViewPrivate::shouldAutoScroll(QAbstractItemViewPrivate *this,QPoint *pos)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  QRect QVar4;
  
  if (this->autoScroll == true) {
    QVar4 = QWidgetPrivate::clipRect
                      (*(QWidgetPrivate **)
                        &((this->super_QAbstractScrollAreaPrivate).viewport)->field_0x8);
    iVar1 = (pos->yp).m_i;
    iVar2 = this->autoScrollMargin;
    bVar3 = true;
    if (((iVar2 <= iVar1 - QVar4.y1.m_i) && (iVar2 <= QVar4.y2.m_i.m_i - iVar1)) &&
       (iVar1 = (pos->xp).m_i, iVar2 <= iVar1 - QVar4.x1.m_i)) {
      bVar3 = QVar4.x2.m_i.m_i - iVar1 < iVar2;
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool QAbstractItemViewPrivate::shouldAutoScroll(const QPoint &pos) const
{
    if (!autoScroll)
        return false;
    const QRect area = QWidgetPrivate::get(viewport)->clipRect();
    return (pos.y() - area.top() < autoScrollMargin)
        || (area.bottom() - pos.y() < autoScrollMargin)
        || (pos.x() - area.left() < autoScrollMargin)
        || (area.right() - pos.x() < autoScrollMargin);
}